

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_find_sibling_dup_inst_set(lyd_node *siblings,lyd_node *target,ly_set **set)

{
  ly_ctx *plVar1;
  lyd_node_inner *plVar2;
  LY_ERR LVar3;
  lysc_node *plVar4;
  lysc_node *plVar5;
  bool bVar6;
  lysc_node *local_98;
  lysc_node *local_88;
  ly_ctx *local_80;
  ly_ctx *local_78;
  ly_ctx *local_70;
  ly_ctx *local_60;
  ly_ctx *local_58;
  LY_ERR ret__;
  uint32_t comp_opts;
  lyd_node_inner *parent;
  lyd_node *iter;
  lyd_node *first;
  lyd_node **match_p;
  ly_set **set_local;
  lyd_node *target_local;
  lyd_node *siblings_local;
  
  match_p = (lyd_node **)set;
  set_local = (ly_set **)target;
  target_local = siblings;
  if (target == (lyd_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","target",
           "lyd_find_sibling_dup_inst_set");
    return LY_EINVAL;
  }
  if (set == (ly_set **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","set",
           "lyd_find_sibling_dup_inst_set");
    return LY_EINVAL;
  }
  if (siblings != (lyd_node *)0x0) {
    if (siblings->schema == (lysc_node *)0x0) {
      plVar1 = (ly_ctx *)siblings[2].schema;
    }
    else {
      plVar1 = siblings->schema->module->ctx;
    }
    if (plVar1 != (ly_ctx *)0x0) {
      if (target->schema == (lysc_node *)0x0) {
        plVar1 = (ly_ctx *)target[2].schema;
      }
      else {
        plVar1 = target->schema->module->ctx;
      }
      if (plVar1 != (ly_ctx *)0x0) {
        if (siblings == (lyd_node *)0x0) {
          local_60 = (ly_ctx *)0x0;
        }
        else {
          if (siblings->schema == (lysc_node *)0x0) {
            local_58 = (ly_ctx *)siblings[2].schema;
          }
          else {
            local_58 = siblings->schema->module->ctx;
          }
          local_60 = local_58;
        }
        if (target->schema == (lysc_node *)0x0) {
          local_70 = (ly_ctx *)target[2].schema;
        }
        else {
          local_70 = target->schema->module->ctx;
        }
        if (local_60 != local_70) {
          if (siblings == (lyd_node *)0x0) {
            local_80 = (ly_ctx *)0x0;
          }
          else {
            if (siblings->schema == (lysc_node *)0x0) {
              local_78 = (ly_ctx *)siblings[2].schema;
            }
            else {
              local_78 = siblings->schema->module->ctx;
            }
            local_80 = local_78;
          }
          ly_log(local_80,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
          return LY_EINVAL;
        }
      }
    }
  }
  LVar3 = ly_set_new(set);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  if (target_local == (lyd_node *)0x0) {
LAB_001319d2:
    siblings_local._4_4_ = LY_ENOTFOUND;
  }
  else {
    if (target_local->schema != (lysc_node *)0x0) {
      if (target_local->schema == (lysc_node *)0x0) {
        local_88 = (lysc_node *)0x0;
      }
      else {
        local_88 = target_local->schema->parent;
      }
      plVar4 = lysc_data_node(local_88);
      if (set_local[1] == (ly_set *)0x0) {
        local_98 = (lysc_node *)0x0;
      }
      else {
        local_98 = *(lysc_node **)(set_local[1] + 1);
      }
      plVar5 = lysc_data_node(local_98);
      if (plVar4 != plVar5) goto LAB_001319d2;
    }
    bVar6 = false;
    if ((set_local[1] != (ly_set *)0x0) &&
       ((((short)set_local[1]->size != 0x10 || (bVar6 = true, (set_local[1]->size & 0x2000000) == 0)
         ) && (bVar6 = false, (short)set_local[1]->size == 8)))) {
      bVar6 = (set_local[1]->size & 0x10000) == 0;
    }
    target_local = lyd_first_sibling(target_local);
    plVar2 = target_local->parent;
    if (((plVar2 == (lyd_node_inner *)0x0) || ((plVar2->field_0).node.schema == (lysc_node *)0x0))
       || (plVar2->children_ht == (ly_ht *)0x0)) {
      for (; target_local != (lyd_node *)0x0; target_local = target_local->next) {
        LVar3 = lyd_compare_single((lyd_node *)set_local,target_local,(uint)bVar6);
        if (LVar3 == LY_SUCCESS) {
          ly_set_add((ly_set *)*match_p,target_local,'\x01',(uint32_t *)0x0);
        }
      }
    }
    else {
      if (*(int *)set_local == 0) {
        __assert_fail("target->hash",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                      ,0xc88,
                      "LY_ERR lyd_find_sibling_dup_inst_set(const struct lyd_node *, const struct lyd_node *, struct ly_set **)"
                     );
      }
      lyd_find_sibling_first(target_local,(lyd_node *)set_local,&iter);
      if (iter != (lyd_node *)0x0) {
        LVar3 = ly_set_add((ly_set *)*match_p,iter,'\x01',(uint32_t *)0x0);
        if (LVar3 != LY_SUCCESS) {
LAB_00131c64:
          ly_set_free((ly_set *)*match_p,(_func_void_void_ptr *)0x0);
          *match_p = (lyd_node *)0x0;
          return LY_EMEM;
        }
        LVar3 = lyht_find(plVar2->children_ht,&set_local,*(uint32_t *)set_local,&first);
        if (LVar3 == LY_SUCCESS) {
          parent = *(lyd_node_inner **)first;
        }
        else {
          parent = (lyd_node_inner *)0x0;
        }
        while (parent != (lyd_node_inner *)0x0) {
          if (((parent != (lyd_node_inner *)iter) &&
              (LVar3 = lyd_compare_single((lyd_node *)parent,(lyd_node *)set_local,(uint)bVar6),
              LVar3 == LY_SUCCESS)) &&
             (LVar3 = ly_set_add((ly_set *)*match_p,parent,'\x01',(uint32_t *)0x0),
             LVar3 != LY_SUCCESS)) goto LAB_00131c64;
          LVar3 = lyht_find_next(plVar2->children_ht,&parent,(parent->field_0).node.hash,&first);
          if (LVar3 == LY_SUCCESS) {
            parent = *(lyd_node_inner **)first;
          }
          else {
            parent = (lyd_node_inner *)0x0;
          }
        }
      }
    }
    if ((*match_p)->flags == 0) {
      siblings_local._4_4_ = LY_ENOTFOUND;
    }
    else {
      siblings_local._4_4_ = LY_SUCCESS;
    }
  }
  return siblings_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_find_sibling_dup_inst_set(const struct lyd_node *siblings, const struct lyd_node *target, struct ly_set **set)
{
    struct lyd_node **match_p, *first, *iter;
    struct lyd_node_inner *parent;
    uint32_t comp_opts;

    LY_CHECK_ARG_RET(NULL, target, set, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(siblings ? LYD_CTX(siblings) : NULL, LYD_CTX(target), LY_EINVAL);

    LY_CHECK_RET(ly_set_new(set));

    if (!siblings || (siblings->schema && (lysc_data_parent(siblings->schema) != lysc_data_parent(target->schema)))) {
        /* no data or schema mismatch */
        return LY_ENOTFOUND;
    }

    /* set options */
    comp_opts = (lysc_is_dup_inst_list(target->schema) ? LYD_COMPARE_FULL_RECURSION : 0);

    /* get first sibling */
    siblings = lyd_first_sibling(siblings);

    parent = siblings->parent;
    if (parent && parent->schema && parent->children_ht) {
        assert(target->hash);

        /* find the first instance */
        lyd_find_sibling_first(siblings, target, &first);
        if (first) {
            /* add it so that it is the first in the set */
            if (ly_set_add(*set, first, 1, NULL)) {
                goto error;
            }

            /* find by hash */
            if (!lyht_find(parent->children_ht, &target, target->hash, (void **)&match_p)) {
                iter = *match_p;
            } else {
                /* not found */
                iter = NULL;
            }
            while (iter) {
                /* add all found nodes into the set */
                if ((iter != first) && !lyd_compare_single(iter, target, comp_opts) && ly_set_add(*set, iter, 1, NULL)) {
                    goto error;
                }

                /* find next instance */
                if (lyht_find_next(parent->children_ht, &iter, iter->hash, (void **)&match_p)) {
                    iter = NULL;
                } else {
                    iter = *match_p;
                }
            }
        }
    } else {
        /* no children hash table */
        LY_LIST_FOR(siblings, siblings) {
            if (!lyd_compare_single(target, siblings, comp_opts)) {
                ly_set_add(*set, (void *)siblings, 1, NULL);
            }
        }
    }

    if (!(*set)->count) {
        return LY_ENOTFOUND;
    }
    return LY_SUCCESS;

error:
    ly_set_free(*set, NULL);
    *set = NULL;
    return LY_EMEM;
}